

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O2

void tag_eval(mdl_t *mdl,double *te,double *se)

{
  uint W;
  uint32_t size;
  uint32_t batch;
  void *__ptr;
  size_t size_00;
  long lVar1;
  undefined8 *puVar2;
  uint32_t w;
  ulong uVar3;
  void **ud;
  dat_t *pdVar4;
  ulong uVar5;
  size_t sStack_70;
  double *local_68 [2];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_68[0] = se;
  local_68[1] = te;
  pdVar4 = mdl->devel;
  W = mdl->opt->nthread;
  uVar5 = (ulong)W;
  if (pdVar4 == (dat_t *)0x0) {
    pdVar4 = mdl->train;
  }
  lVar1 = -(uVar5 * 8 + 0xf & 0xfffffffffffffff0);
  ud = (void **)((long)local_68 + lVar1);
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    *(undefined8 *)((long)&sStack_70 + lVar1) = 0x30;
    size_00 = *(size_t *)((long)&sStack_70 + lVar1);
    *(undefined8 *)((long)&sStack_70 + lVar1) = 0x1079fc;
    puVar2 = (undefined8 *)xmalloc(size_00);
    ud[uVar3] = puVar2;
    *puVar2 = mdl;
    puVar2[1] = pdVar4;
  }
  size = pdVar4->nseq;
  batch = mdl->opt->jobsize;
  *(undefined8 *)((long)&sStack_70 + lVar1) = 0x107a2a;
  mth_spawn(tag_evalsub,W,ud,size,batch);
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    __ptr = ud[uVar3];
    local_48._8_8_ = local_48._8_8_ + *(long *)((long)__ptr + 0x18);
    local_48._0_8_ = local_48._0_8_ + *(long *)((long)__ptr + 0x10);
    local_58._8_8_ = local_58._8_8_ + *(long *)((long)__ptr + 0x28);
    local_58._0_8_ = local_58._0_8_ + *(long *)((long)__ptr + 0x20);
    *(undefined8 *)((long)&sStack_70 + lVar1) = 0x107a6e;
    free(__ptr);
  }
  *local_68[1] = ((((double)((ulong)local_48._8_8_ >> 0x20 | 0x4530000000000000) -
                   1.9342813118337666e+25) +
                  (double)(local_48._8_8_ & 0xffffffff | 0x4330000000000000)) /
                 (((double)((ulong)local_48._0_8_ >> 0x20 | 0x4530000000000000) -
                  1.9342813118337666e+25) +
                 (double)(local_48._0_8_ & 0xffffffff | 0x4330000000000000))) * 100.0;
  *local_68[0] = ((((double)((ulong)local_58._8_8_ >> 0x20 | 0x4530000000000000) -
                   1.9342813118337666e+25) +
                  (double)(local_58._8_8_ & 0xffffffff | 0x4330000000000000)) /
                 (((double)((ulong)local_58._0_8_ >> 0x20 | 0x4530000000000000) -
                  1.9342813118337666e+25) +
                 (double)(local_58._0_8_ & 0xffffffff | 0x4330000000000000))) * 100.0;
  return;
}

Assistant:

void tag_eval(mdl_t *mdl, double *te, double *se) {
	const uint32_t W = mdl->opt->nthread;
	dat_t *dat = (mdl->devel == NULL) ? mdl->train : mdl->devel;
	// First we prepare the eval state for all the workers threads, we just
	// have to give them the model and dataset to use. This state will be
	// used to retrieve partial result they computed.
	eval_t *eval[W];
	for (uint32_t w = 0; w < W; w++) {
		eval[w] = xmalloc(sizeof(eval_t));
		eval[w]->mdl = mdl;
		eval[w]->dat = dat;
	}
	// And next, we call the workers to do the job and reduce the partial
	// result by summing them and computing the final error rates.
	mth_spawn((func_t *)tag_evalsub, W, (void *)eval, dat->nseq,
		mdl->opt->jobsize);
	uint64_t tcnt = 0, terr = 0;
	uint64_t scnt = 0, serr = 0;
	for (uint32_t w = 0; w < W; w++) {
		tcnt += eval[w]->tcnt;
		terr += eval[w]->terr;
		scnt += eval[w]->scnt;
		serr += eval[w]->serr;
		free(eval[w]);
	}
	*te = (double)terr / tcnt * 100.0;
	*se = (double)serr / scnt * 100.0;
}